

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void __thiscall gimage::anon_unknown_6::TiffImage<float>::~TiffImage(TiffImage<float> *this)

{
  undefined8 *in_RDI;
  Image<float,_gimage::PixelTraits<float>_> *unaff_retaddr;
  
  TIFFClose(*in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)unaff_retaddr);
  Image<float,_gimage::PixelTraits<float>_>::~Image(unaff_retaddr);
  return;
}

Assistant:

~TiffImage()
    {
      TIFFClose(tif);
    }